

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

void __thiscall cs::statement_foreach::run_impl(statement_foreach *this)

{
  context_t *context;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  runtime_error *this_00;
  type_info *ptVar3;
  undefined1 local_40 [16];
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)(this->mObj).mRoot;
  runtime_type::parse_expr
            ((runtime_type *)local_40,
             (iterator *)
             (((this->super_statement_base).context.
               super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
             super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             SUB81(&local_30,0));
  if ((proxy *)local_40._0_8_ == (proxy *)0x0) {
    ptVar3 = (type_info *)&void::typeinfo;
  }
  else {
    iVar2 = (*(*(baseHolder **)(local_40._0_8_ + 0x10))->_vptr_baseHolder[2])();
    ptVar3 = (type_info *)CONCAT44(extraout_var,iVar2);
  }
  context = &(this->super_statement_base).context;
  bVar1 = std::type_info::operator==(ptVar3,(type_info *)&std::__cxx11::string::typeinfo);
  if (bVar1) {
    foreach_helper<std::__cxx11::string,char>(context,&this->mIt,(var *)local_40,&this->mBlock);
  }
  else {
    if ((proxy *)local_40._0_8_ == (proxy *)0x0) {
      ptVar3 = (type_info *)&void::typeinfo;
    }
    else {
      iVar2 = (*(*(baseHolder **)(local_40._0_8_ + 0x10))->_vptr_baseHolder[2])();
      ptVar3 = (type_info *)CONCAT44(extraout_var_00,iVar2);
    }
    bVar1 = std::type_info::operator==
                      (ptVar3,(type_info *)
                              &std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>::
                               typeinfo);
    if (bVar1) {
      foreach_helper<std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>,cs_impl::any>
                (context,&this->mIt,(var *)local_40,&this->mBlock);
    }
    else {
      if ((proxy *)local_40._0_8_ == (proxy *)0x0) {
        ptVar3 = (type_info *)&void::typeinfo;
      }
      else {
        iVar2 = (*(*(baseHolder **)(local_40._0_8_ + 0x10))->_vptr_baseHolder[2])();
        ptVar3 = (type_info *)CONCAT44(extraout_var_01,iVar2);
      }
      bVar1 = std::type_info::operator==
                        (ptVar3,(type_info *)
                                &std::deque<cs_impl::any,std::allocator<cs_impl::any>>::typeinfo);
      if (bVar1) {
        foreach_helper<std::deque<cs_impl::any,std::allocator<cs_impl::any>>,cs_impl::any>
                  (context,&this->mIt,(var *)local_40,&this->mBlock);
      }
      else {
        if ((proxy *)local_40._0_8_ == (proxy *)0x0) {
          ptVar3 = (type_info *)&void::typeinfo;
        }
        else {
          iVar2 = (*(*(baseHolder **)(local_40._0_8_ + 0x10))->_vptr_baseHolder[2])();
          ptVar3 = (type_info *)CONCAT44(extraout_var_02,iVar2);
        }
        bVar1 = std::type_info::operator==
                          (ptVar3,(type_info *)
                                  &phmap::
                                   flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>
                                   ::typeinfo);
        if (bVar1) {
          foreach_helper<phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>,cs_impl::any>
                    (context,&this->mIt,(var *)local_40,&this->mBlock);
        }
        else {
          if ((proxy *)local_40._0_8_ == (proxy *)0x0) {
            ptVar3 = (type_info *)&void::typeinfo;
          }
          else {
            iVar2 = (*(*(baseHolder **)(local_40._0_8_ + 0x10))->_vptr_baseHolder[2])();
            ptVar3 = (type_info *)CONCAT44(extraout_var_03,iVar2);
          }
          bVar1 = std::type_info::operator==
                            (ptVar3,(type_info *)
                                    &phmap::
                                     flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
                                     ::typeinfo);
          if (bVar1) {
            foreach_helper<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>,std::pair<cs_impl::any,cs_impl::any>>
                      (context,&this->mIt,(var *)local_40,&this->mBlock);
          }
          else {
            if ((proxy *)local_40._0_8_ == (proxy *)0x0) {
              ptVar3 = (type_info *)&void::typeinfo;
            }
            else {
              iVar2 = (*(*(baseHolder **)(local_40._0_8_ + 0x10))->_vptr_baseHolder[2])();
              ptVar3 = (type_info *)CONCAT44(extraout_var_04,iVar2);
            }
            bVar1 = std::type_info::operator==(ptVar3,(type_info *)&range_type::typeinfo);
            if (!bVar1) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
              std::__cxx11::string::string
                        ((string *)&local_30,"Unsupported type(foreach)",
                         (allocator *)(local_40 + 0xf));
              runtime_error::runtime_error(this_00,&local_30);
              __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
            }
            foreach_helper<cs::range_type,cs::numeric>
                      (context,&this->mIt,(var *)local_40,&this->mBlock);
          }
        }
      }
    }
  }
  cs_impl::any::recycle((any *)local_40);
  return;
}

Assistant:

void statement_foreach::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		const var &obj = context->instance->parse_expr(this->mObj.root());
		if (obj.type() == typeid(string))
			foreach_helper<string, char>(context, this->mIt, obj, this->mBlock);
		else if (obj.type() == typeid(list))
			foreach_helper<list, var>(context, this->mIt, obj, this->mBlock);
		else if (obj.type() == typeid(array))
			foreach_helper<array, var>(context, this->mIt, obj, this->mBlock);
		else if (obj.type() == typeid(hash_set))
			foreach_helper<hash_set, var>(context, this->mIt, obj, this->mBlock);
		else if (obj.type() == typeid(hash_map))
			foreach_helper<hash_map, pair>(context, this->mIt, obj, this->mBlock);
		else if (obj.type() == typeid(range_type))
			foreach_helper<range_type, numeric>(context, this->mIt, obj, this->mBlock);
		else
			throw runtime_error("Unsupported type(foreach)");
	}